

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AirLock.hpp
# Opt level: O1

void __thiscall
gmlc::containers::AirLock<std::any,std::mutex,std::condition_variable>::
load<std::shared_ptr<helics::FederateOperator>>
          (AirLock<std::any,std::mutex,std::condition_variable> *this,
          shared_ptr<helics::FederateOperator> *val)

{
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_30;
  
  local_30._M_device = (mutex_type *)(this + 8);
  local_30._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_30);
  local_30._M_owns = true;
  if ((((byte)*this & 1) != 0) && (((byte)*this & 1) != 0)) {
    do {
      std::condition_variable::wait((unique_lock *)(this + 0x40));
    } while (((byte)*this & 1) != 0);
  }
  std::any::operator=((any *)(this + 0x30),val);
  *this = (AirLock<std::any,std::mutex,std::condition_variable>)0x1;
  std::unique_lock<std::mutex>::~unique_lock(&local_30);
  return;
}

Assistant:

void load(Z&& val)
    {
        std::unique_lock<MUTEX> lock(door);
        if (!loaded.load(std::memory_order_acquire)) {
            data = std::forward<Z>(val);
            loaded.store(true, std::memory_order_release);
        } else {
            while (loaded.load(std::memory_order_acquire)) {
                condition.wait(lock);
            }
            data = std::forward<Z>(val);
            loaded.store(true, std::memory_order_release);
        }
    }